

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O1

QRect __thiscall QStatusBarPrivate::messageRect(QStatusBarPrivate *this)

{
  QWidget *this_00;
  QWidget *pQVar1;
  QWidgetData *pQVar2;
  long lVar3;
  SBItem *pSVar4;
  LayoutDirection LVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  QRect QVar12;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  LVar5 = QWidget::layoutDirection(this_00);
  iVar10 = ((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + -0xb;
  pQVar1 = &this->resizer->super_QWidget;
  uVar7 = 6;
  iVar6 = iVar10;
  if (((pQVar1 != (QWidget *)0x0) && ((pQVar1->data->widget_attributes & 0x8000) != 0)) &&
     (iVar6 = QWidget::x(pQVar1), LVar5 == RightToLeft)) {
    pQVar2 = (this->resizer->super_QWidget).data;
    uVar7 = ((iVar6 + (pQVar2->crect).x2.m_i) - (pQVar2->crect).x1.m_i) + 1;
    iVar6 = iVar10;
  }
  lVar3 = (this->items).d.size;
  iVar10 = iVar6;
  if (lVar3 != 0) {
    pSVar4 = (this->items).d.ptr;
    lVar11 = 0;
    do {
      if ((*(int *)((long)&pSVar4->category + lVar11) == 1) &&
         (pQVar1 = *(QWidget **)((long)&pSVar4->widget + lVar11),
         (pQVar1->data->widget_attributes & 0x8000) != 0)) {
        iVar8 = QWidget::x(pQVar1);
        if (LVar5 == RightToLeft) {
          lVar3 = *(long *)(*(long *)((long)&pSVar4->widget + lVar11) + 0x20);
          uVar9 = ((iVar8 + *(int *)(lVar3 + 0x1c)) - *(int *)(lVar3 + 0x14)) + 3;
          if ((int)uVar7 <= (int)uVar9) {
            uVar7 = uVar9;
          }
        }
        else {
          iVar10 = iVar8 + -2;
          if (iVar6 < iVar8 + -2) {
            iVar10 = iVar6;
          }
        }
        break;
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar3 << 4 != lVar11);
  }
  QVar12.y1.m_i = 0;
  QVar12.x1.m_i = uVar7;
  QVar12.y2.m_i = (this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i;
  QVar12.x2.m_i = iVar10 + -1;
  return QVar12;
}

Assistant:

QRect QStatusBarPrivate::messageRect() const
{
    Q_Q(const QStatusBar);
    const bool rtl = q->layoutDirection() == Qt::RightToLeft;

    int left = 6;
    int right = q->width() - 12;

#if QT_CONFIG(sizegrip)
    if (resizer && resizer->isVisible()) {
        if (rtl)
            left = resizer->x() + resizer->width();
        else
            right = resizer->x();
    }
#endif

    for (const auto &item : items) {
        if (item.isPermanent() && item.widget->isVisible()) {
            if (rtl)
                left = qMax(left, item.widget->x() + item.widget->width() + 2);
            else
                right = qMin(right, item.widget->x() - 2);
            break;
        }
    }
    return QRect(left, 0, right-left, q->height());
}